

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::DuplicateColsPS::DuplicateColsPS
          (DuplicateColsPS *this,DuplicateColsPS *old)

{
  double dVar1;
  int iVar2;
  
  PostStep::PostStep(&this->super_PostStep,&old->super_PostStep);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DuplicateColsPS_003343b8;
  iVar2 = old->m_k;
  this->m_j = old->m_j;
  this->m_k = iVar2;
  dVar1 = old->m_upJ;
  this->m_loJ = old->m_loJ;
  this->m_upJ = dVar1;
  dVar1 = old->m_upK;
  this->m_loK = old->m_loK;
  this->m_upK = dVar1;
  this->m_scale = old->m_scale;
  this->m_isFirst = old->m_isFirst;
  this->m_isLast = old->m_isLast;
  DataArray<int>::DataArray(&this->m_perm,&old->m_perm);
  return;
}

Assistant:

DuplicateColsPS(const DuplicateColsPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_k(old.m_k)
         , m_loJ(old.m_loJ)
         , m_upJ(old.m_upJ)
         , m_loK(old.m_loK)
         , m_upK(old.m_upK)
         , m_scale(old.m_scale)
         , m_isFirst(old.m_isFirst)
         , m_isLast(old.m_isLast)
         , m_perm(old.m_perm)
      {}